

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O3

NodeRef<typename_KeyConverter::Key> __thiscall
miniscript::FromScript<(anonymous_namespace)::KeyConverter>
          (miniscript *this,CScript *script,KeyConverter *ctx)

{
  pointer psVar1;
  MiniscriptContext MVar2;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  _Var3;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  _Var4;
  pointer this_00;
  uint uVar5;
  undefined1 *puVar6;
  pointer pCVar7;
  pointer pCVar8;
  undefined8 uVar9;
  pointer ppVar10;
  bool bVar11;
  uint uVar12;
  opcodetype oVar13;
  ulong uVar14;
  pointer *ppuVar15;
  element_type *peVar16;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var17;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  Fragment nt;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var18;
  int i;
  long lVar19;
  long lVar20;
  long lVar21;
  _Storage<long,_true> _Var22;
  _Storage<long,_true> _Var23;
  void *pvVar24;
  Node<CPubKey> *pNVar25;
  long in_FS_OFFSET;
  optional<long> oVar26;
  NodeRef<typename_KeyConverter::Key> NVar27;
  vector<CPubKey,_std::allocator<CPubKey>_> keys;
  vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
  constructed;
  vector<std::tuple<miniscript::internal::DecodeContext,_long,_long>,_std::allocator<std::tuple<miniscript::internal::DecodeContext,_long,_long>_>_>
  to_parse;
  optional<std::vector<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
  decomposed;
  optional<long> k;
  optional<CPubKey> key;
  pointer local_1a8;
  int local_194;
  pointer local_188;
  Fragment local_170;
  NoDupCheck local_169;
  Node<CPubKey> *local_168;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_160 [2];
  MiniscriptContext local_14c;
  vector<CPubKey,_std::allocator<CPubKey>_> local_148;
  vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
  local_128;
  void *local_108;
  void *pvStack_100;
  long local_f8;
  NoDupCheck local_e9;
  _Storage<std::vector<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_false>
  local_e8;
  char local_d0;
  _Storage<long,_true> local_c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_c0;
  _Storage<long,_true> local_b8;
  undefined1 auStack_b0 [5];
  undefined3 uStack_ab;
  long local_a8;
  ulong uStack_a0;
  ulong local_98;
  undefined1 local_88 [65];
  bool local_47;
  element_type *local_38;
  
  local_38 = *(element_type **)(in_FS_OFFSET + 0x28);
  uVar12 = (script->super_CScriptBase)._size;
  uVar5 = uVar12 - 0x1d;
  if (uVar12 < 0x1d) {
    uVar5 = uVar12;
  }
  MVar2 = ctx->m_script_ctx;
  _Var17._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)MVar2;
  uVar12 = 0xe10;
  if (MVar2 != P2WSH) {
    if (MVar2 != TAPSCRIPT) {
LAB_004778ba:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                    ,0xf6,"bool miniscript::IsTapscript(MiniscriptContext)");
    }
    uVar12 = 0x5070a;
  }
  if (uVar12 < uVar5) {
    peVar16 = *(element_type **)(in_FS_OFFSET + 0x28);
    if (peVar16 != local_38) goto LAB_00477d4b;
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
    goto LAB_00477895;
  }
  internal::DecomposeScript
            ((optional<std::vector<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
              *)&local_e8._M_value,script);
  uVar9 = local_e8._M_value.
          super__Vector_base<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish;
  if (local_d0 == '\0') {
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
    _Var17._M_pi = extraout_RDX;
  }
  else {
    local_f8 = 0;
    local_108 = (void *)0x0;
    pvStack_100 = (void *)0x0;
    local_128.
    super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_128.
    super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_128.
    super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88._0_4_ = 1;
    local_a8 = CONCAT44(local_a8._4_4_,0xffffffff);
    local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)CONCAT44(local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,0xffffffff);
    std::
    vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
    ::emplace_back<miniscript::internal::DecodeContext,int,int>
              ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                *)&local_108,(DecodeContext *)local_88,(int *)&local_a8,(int *)&local_148);
    local_1a8 = local_e8._M_value.
                super__Vector_base<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    if (local_108 != pvStack_100) {
LAB_004755ef:
      ppVar10 = local_1a8;
      if ((local_128.
           super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start !=
           local_128.
           super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) &&
         (bVar11 = Node<CPubKey>::IsValid
                             (local_128.
                              super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish[-1].
                              super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr), !bVar11)) goto LAB_004777fc;
      psVar1 = local_128.
               super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pvVar24 = (void *)((long)pvStack_100 + -0x18);
      local_98 = *(ulong *)((long)pvStack_100 + -8);
      local_a8 = *(long *)((long)pvStack_100 + -0x18);
      uStack_a0 = *(ulong *)((long)pvStack_100 + -0x10);
      pvStack_100 = pvVar24;
      switch(local_98 & 0xffffffff) {
      case 0:
        if ((ulong)uVar9 <= local_1a8) goto LAB_004777fc;
        oVar13 = local_1a8->first;
        if (oVar13 == OP_0) {
          local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,ctx->m_script_ctx);
          local_b8._M_value = (ulong)(uint)local_b8._M_value._4_4_ << 0x20;
          local_88._0_8_ = (element_type *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<miniscript::Node<CPubKey>const,std::allocator<miniscript::Node<CPubKey>>,miniscript::internal::NoDupCheck,miniscript::MiniscriptContext,miniscript::Fragment>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8),
                     (Node<CPubKey> **)local_88,(allocator<miniscript::Node<CPubKey>_> *)&local_c8,
                     (NoDupCheck *)&local_168,(MiniscriptContext *)&local_148,
                     (Fragment *)&local_b8._M_value);
          std::
          vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
          ::emplace_back<std::shared_ptr<miniscript::Node<CPubKey>const>>
                    ((vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
                      *)&local_128,(shared_ptr<const_miniscript::Node<CPubKey>_> *)local_88);
        }
        else {
          if (oVar13 != OP_1) {
            _Var3._M_current =
                 (local_1a8->second).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
            _Var4._M_current =
                 (local_1a8->second).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (((long)_Var4._M_current - (long)_Var3._M_current & 0xfffffffffffffffeU) == 0x20) {
              (anonymous_namespace)::KeyConverter::
              FromPKBytes<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                        ((optional<CPubKey> *)local_88,(void *)(ulong)ctx->m_script_ctx,_Var3,_Var4)
              ;
              if (local_47 != false) {
                local_c8._M_value._0_4_ = ctx->m_script_ctx;
                local_168 = (Node<CPubKey> *)CONCAT44(local_168._4_4_,2);
                local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                super__Vector_impl_data._M_finish = (CPubKey *)0x0;
                local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (CPubKey *)0x0;
                std::vector<CPubKey,_std::allocator<CPubKey>_>::reserve(&local_148,1);
                pCVar7 = local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                if (local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                    super__Vector_impl_data._M_finish ==
                    local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<CPubKey,_std::allocator<CPubKey>_>::_M_realloc_insert<CPubKey>
                            (&local_148,
                             (iterator)
                             local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl
                             .super__Vector_impl_data._M_finish,(CPubKey *)local_88);
                }
                else {
                  memcpy(local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                         super__Vector_impl_data._M_finish,local_88,0x41);
                  local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                  super__Vector_impl_data._M_finish = pCVar7 + 1;
                }
                local_b8._M_value = 0;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                __shared_count<miniscript::Node<CPubKey>const,std::allocator<miniscript::Node<CPubKey>>,miniscript::internal::NoDupCheck,miniscript::MiniscriptContext,miniscript::Fragment,std::vector<CPubKey,std::allocator<CPubKey>>>
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)auStack_b0,
                           (Node<CPubKey> **)&local_b8,
                           (allocator<miniscript::Node<CPubKey>_> *)&local_14c,
                           (NoDupCheck *)&local_170,(MiniscriptContext *)&local_c8._M_value,
                           (Fragment *)&local_168,&local_148);
                std::
                vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
                ::emplace_back<std::shared_ptr<miniscript::Node<CPubKey>const>>
                          ((vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
                            *)&local_128,(shared_ptr<const_miniscript::Node<CPubKey>_> *)&local_b8);
                if (_auStack_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_auStack_b0);
                }
                if ((element_type *)
                    local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                    super__Vector_impl_data._M_start != (element_type *)0x0) {
                  operator_delete(local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)local_148.
                                        super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_148.
                                        super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
                }
                goto LAB_004768fa;
              }
              goto LAB_004777fc;
            }
            lVar20 = uVar9 - (long)local_1a8;
            lVar19 = lVar20 >> 5;
            if (lVar19 < 5) {
              _auStack_b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                            ((ulong)stack0xffffffffffffff51 << 8);
              if ((1 < lVar19) && (oVar13 == OP_CHECKSEQUENCEVERIFY)) {
LAB_00476918:
                oVar26 = internal::ParseScriptNumber(local_1a8 + 1);
                local_b8._M_value =
                     oVar26.super__Optional_base<long,_true,_true>._M_payload.
                     super__Optional_payload_base<long>._M_payload;
                uStack_ab = SUB83(local_88._0_8_,4);
                auStack_b0._1_4_ = local_88._0_4_;
                auStack_b0[0] =
                     oVar26.super__Optional_base<long,_true,_true>._M_payload.
                     super__Optional_payload_base<long>._M_engaged;
                if (((undefined1  [16])
                     oVar26.super__Optional_base<long,_true,_true>._M_payload.
                     super__Optional_payload_base<long> & (undefined1  [16])0x1) ==
                    (undefined1  [16])0x0) goto LAB_004769ec;
                ppVar10 = local_1a8 + 2;
                if (0xffffffff80000000 < local_b8._M_value - 0x80000000U) {
                  local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                  super__Vector_impl_data._M_start =
                       (pointer)CONCAT44(local_148.
                                         super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                         _M_impl.super__Vector_impl_data._M_start._4_4_,
                                         ctx->m_script_ctx);
                  local_c8._M_value._0_4_ = 4;
                  local_88._0_8_ = (element_type *)0x0;
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                  __shared_count<miniscript::Node<CPubKey>const,std::allocator<miniscript::Node<CPubKey>>,miniscript::internal::NoDupCheck,miniscript::MiniscriptContext,miniscript::Fragment,long&>
                            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8),
                             (Node<CPubKey> **)local_88,
                             (allocator<miniscript::Node<CPubKey>_> *)&local_168,
                             (NoDupCheck *)&local_14c,(MiniscriptContext *)&local_148,
                             (Fragment *)&local_c8._M_value,&local_b8._M_value);
                  std::
                  vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
                  ::emplace_back<std::shared_ptr<miniscript::Node<CPubKey>const>>
                            ((vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
                              *)&local_128,(shared_ptr<const_miniscript::Node<CPubKey>_> *)local_88)
                  ;
LAB_00476ac4:
                  local_1a8 = local_1a8 + 2;
                  peVar16 = (element_type *)local_88._8_8_;
                  goto LAB_00475ed3;
                }
                goto LAB_004777fc;
              }
              if (0x20 < lVar20) goto LAB_004769ec;
            }
            else {
              if (oVar13 == OP_VERIFY) {
                if (((local_1a8[1].first == OP_EQUAL) && (local_1a8[3].first == OP_HASH160)) &&
                   (local_1a8[4].first == OP_DUP)) {
                  this_00 = local_1a8[2].second.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start;
                  _Var3._M_current =
                       local_1a8[2].second.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish;
                  if ((long)_Var3._M_current - (long)this_00 == 0x14) {
                    (anonymous_namespace)::KeyConverter::
                    FromPKHBytes<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                              ((optional<CPubKey> *)local_88,this_00,_Var3,_Var4);
                    if (local_47 != false) {
                      local_c8._M_value._0_4_ = ctx->m_script_ctx;
                      local_168 = (Node<CPubKey> *)CONCAT44(local_168._4_4_,3);
                      Vector<CPubKey>(&local_148,(CPubKey *)local_88);
                      local_b8._M_value = 0;
                      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                      __shared_count<miniscript::Node<CPubKey>const,std::allocator<miniscript::Node<CPubKey>>,miniscript::internal::NoDupCheck,miniscript::MiniscriptContext,miniscript::Fragment,std::vector<CPubKey,std::allocator<CPubKey>>>
                                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)auStack_b0,
                                 (Node<CPubKey> **)&local_b8,
                                 (allocator<miniscript::Node<CPubKey>_> *)&local_14c,
                                 (NoDupCheck *)&local_170,(MiniscriptContext *)&local_c8._M_value,
                                 (Fragment *)&local_168,&local_148);
                      std::
                      vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
                      ::emplace_back<std::shared_ptr<miniscript::Node<CPubKey>const>>
                                ((vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
                                  *)&local_128,
                                 (shared_ptr<const_miniscript::Node<CPubKey>_> *)&local_b8);
                      if (_auStack_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_auStack_b0);
                      }
                      if ((element_type *)
                          local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                          super__Vector_impl_data._M_start != (element_type *)0x0) {
                        operator_delete(local_148.
                                        super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                        _M_impl.super__Vector_impl_data._M_start,
                                        (long)local_148.
                                              super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)local_148.
                                              super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                              _M_impl.super__Vector_impl_data._M_start);
                      }
                      local_1a8 = local_1a8 + 5;
                      break;
                    }
                    goto LAB_004777fc;
                  }
                }
                _auStack_b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                              ((ulong)stack0xffffffffffffff51 << 8);
              }
              else {
                _auStack_b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                              ((ulong)stack0xffffffffffffff51 << 8);
                if (oVar13 == OP_CHECKSEQUENCEVERIFY) goto LAB_00476918;
              }
LAB_004769ec:
              if (local_1a8->first == OP_CHECKLOCKTIMEVERIFY) {
                oVar26 = internal::ParseScriptNumber(local_1a8 + 1);
                local_b8._M_value =
                     oVar26.super__Optional_base<long,_true,_true>._M_payload.
                     super__Optional_payload_base<long>._M_payload;
                uStack_ab = SUB83(local_88._0_8_,4);
                auStack_b0._1_4_ = local_88._0_4_;
                auStack_b0[0] =
                     oVar26.super__Optional_base<long,_true,_true>._M_payload.
                     super__Optional_payload_base<long>._M_engaged;
                if (((undefined1  [16])
                     oVar26.super__Optional_base<long,_true,_true>._M_payload.
                     super__Optional_payload_base<long> & (undefined1  [16])0x1) !=
                    (undefined1  [16])0x0) {
                  ppVar10 = local_1a8 + 2;
                  if (0xffffffff80000000 < local_b8._M_value - 0x80000000U) {
                    local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                    super__Vector_impl_data._M_start =
                         (pointer)CONCAT44(local_148.
                                           super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                           _M_impl.super__Vector_impl_data._M_start._4_4_,
                                           ctx->m_script_ctx);
                    local_c8._M_value._0_4_ = 5;
                    local_88._0_8_ = (element_type *)0x0;
                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                    __shared_count<miniscript::Node<CPubKey>const,std::allocator<miniscript::Node<CPubKey>>,miniscript::internal::NoDupCheck,miniscript::MiniscriptContext,miniscript::Fragment,long&>
                              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8),
                               (Node<CPubKey> **)local_88,
                               (allocator<miniscript::Node<CPubKey>_> *)&local_168,
                               (NoDupCheck *)&local_14c,(MiniscriptContext *)&local_148,
                               (Fragment *)&local_c8._M_value,&local_b8._M_value);
                    std::
                    vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
                    ::emplace_back<std::shared_ptr<miniscript::Node<CPubKey>const>>
                              ((vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
                                *)&local_128,
                               (shared_ptr<const_miniscript::Node<CPubKey>_> *)local_88);
                    goto LAB_00476ac4;
                  }
                  goto LAB_004777fc;
                }
              }
            }
            if (0xc0 < lVar20) {
              if (((local_1a8->first == OP_EQUAL) && (local_1a8[3].first == OP_VERIFY)) &&
                 (local_1a8[4].first == OP_EQUAL)) {
                oVar26 = internal::ParseScriptNumber(local_1a8 + 5);
                local_b8._M_value =
                     oVar26.super__Optional_base<long,_true,_true>._M_payload.
                     super__Optional_payload_base<long>._M_payload;
                uStack_ab = SUB83(local_88._0_8_,4);
                auStack_b0._1_4_ = local_88._0_4_;
                auStack_b0[0] =
                     oVar26.super__Optional_base<long,_true,_true>._M_payload.
                     super__Optional_payload_base<long>._M_engaged;
                if (((local_b8._M_value == 0x20 &
                     oVar26.super__Optional_base<long,_true,_true>._M_payload.
                     super__Optional_payload_base<long>._M_engaged) == 1) &&
                   (local_1a8[6].first == OP_SIZE)) {
                  switch(local_1a8[2].first) {
                  case OP_RIPEMD160:
                    if ((long)local_1a8[1].second.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_1a8[1].second.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start == 0x14) {
                      local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                      super__Vector_impl_data._M_start =
                           (pointer)CONCAT44(local_148.
                                             super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                             _M_impl.super__Vector_impl_data._M_start._4_4_,
                                             ctx->m_script_ctx);
                      local_c8._M_value._0_4_ = 8;
                      local_88._0_8_ = (element_type *)0x0;
                      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                      __shared_count<miniscript::Node<CPubKey>const,std::allocator<miniscript::Node<CPubKey>>,miniscript::internal::NoDupCheck,miniscript::MiniscriptContext,miniscript::Fragment,std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8),
                                 (Node<CPubKey> **)local_88,
                                 (allocator<miniscript::Node<CPubKey>_> *)&local_168,
                                 (NoDupCheck *)&local_14c,(MiniscriptContext *)&local_148,
                                 (Fragment *)&local_c8._M_value,&local_1a8[1].second);
                      std::
                      vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
                      ::emplace_back<std::shared_ptr<miniscript::Node<CPubKey>const>>
                                ((vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
                                  *)&local_128,
                                 (shared_ptr<const_miniscript::Node<CPubKey>_> *)local_88);
LAB_00476de1:
                      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
                          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
                      }
                      local_1a8 = local_1a8 + 7;
                      goto switchD_00475658_default;
                    }
                    break;
                  case OP_SHA256:
                    if ((long)local_1a8[1].second.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_1a8[1].second.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start == 0x20) {
                      local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                      super__Vector_impl_data._M_start =
                           (pointer)CONCAT44(local_148.
                                             super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                             _M_impl.super__Vector_impl_data._M_start._4_4_,
                                             ctx->m_script_ctx);
                      local_c8._M_value._0_4_ = 6;
                      local_88._0_8_ = (element_type *)0x0;
                      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                      __shared_count<miniscript::Node<CPubKey>const,std::allocator<miniscript::Node<CPubKey>>,miniscript::internal::NoDupCheck,miniscript::MiniscriptContext,miniscript::Fragment,std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8),
                                 (Node<CPubKey> **)local_88,
                                 (allocator<miniscript::Node<CPubKey>_> *)&local_168,
                                 (NoDupCheck *)&local_14c,(MiniscriptContext *)&local_148,
                                 (Fragment *)&local_c8._M_value,&local_1a8[1].second);
                      std::
                      vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
                      ::emplace_back<std::shared_ptr<miniscript::Node<CPubKey>const>>
                                ((vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
                                  *)&local_128,
                                 (shared_ptr<const_miniscript::Node<CPubKey>_> *)local_88);
                      goto LAB_00476de1;
                    }
                    break;
                  case OP_HASH160:
                    if ((long)local_1a8[1].second.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_1a8[1].second.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start == 0x14) {
                      local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                      super__Vector_impl_data._M_start =
                           (pointer)CONCAT44(local_148.
                                             super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                             _M_impl.super__Vector_impl_data._M_start._4_4_,
                                             ctx->m_script_ctx);
                      local_c8._M_value._0_4_ = 9;
                      local_88._0_8_ = (element_type *)0x0;
                      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                      __shared_count<miniscript::Node<CPubKey>const,std::allocator<miniscript::Node<CPubKey>>,miniscript::internal::NoDupCheck,miniscript::MiniscriptContext,miniscript::Fragment,std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8),
                                 (Node<CPubKey> **)local_88,
                                 (allocator<miniscript::Node<CPubKey>_> *)&local_168,
                                 (NoDupCheck *)&local_14c,(MiniscriptContext *)&local_148,
                                 (Fragment *)&local_c8._M_value,&local_1a8[1].second);
                      std::
                      vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
                      ::emplace_back<std::shared_ptr<miniscript::Node<CPubKey>const>>
                                ((vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
                                  *)&local_128,
                                 (shared_ptr<const_miniscript::Node<CPubKey>_> *)local_88);
                      goto LAB_00476de1;
                    }
                    break;
                  case OP_HASH256:
                    if ((long)local_1a8[1].second.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_1a8[1].second.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start == 0x20) {
                      local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                      super__Vector_impl_data._M_start =
                           (pointer)CONCAT44(local_148.
                                             super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                             _M_impl.super__Vector_impl_data._M_start._4_4_,
                                             ctx->m_script_ctx);
                      local_c8._M_value._0_4_ = 7;
                      local_88._0_8_ = (element_type *)0x0;
                      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                      __shared_count<miniscript::Node<CPubKey>const,std::allocator<miniscript::Node<CPubKey>>,miniscript::internal::NoDupCheck,miniscript::MiniscriptContext,miniscript::Fragment,std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8),
                                 (Node<CPubKey> **)local_88,
                                 (allocator<miniscript::Node<CPubKey>_> *)&local_168,
                                 (NoDupCheck *)&local_14c,(MiniscriptContext *)&local_148,
                                 (Fragment *)&local_c8._M_value,&local_1a8[1].second);
                      std::
                      vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
                      ::emplace_back<std::shared_ptr<miniscript::Node<CPubKey>const>>
                                ((vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
                                  *)&local_128,
                                 (shared_ptr<const_miniscript::Node<CPubKey>_> *)local_88);
                      goto LAB_00476de1;
                    }
                  }
                }
              }
              oVar13 = local_1a8->first;
LAB_00476e10:
              if (oVar13 == OP_CHECKMULTISIG) {
                if (ctx->m_script_ctx != P2WSH) {
                  if (ctx->m_script_ctx != TAPSCRIPT) goto LAB_004778ba;
                  goto LAB_004777fc;
                }
                local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (CPubKey *)0x0;
                oVar26 = internal::ParseScriptNumber(local_1a8 + 1);
                _Var22._M_value =
                     oVar26.super__Optional_base<long,_true,_true>._M_payload.
                     super__Optional_payload_base<long>._M_payload;
                if (((((undefined1  [16])
                       oVar26.super__Optional_base<long,_true,_true>._M_payload.
                       super__Optional_payload_base<long> & (undefined1  [16])0x1) ==
                      (undefined1  [16])0x0) || (lVar19 < (long)(_Var22._M_value + 3U))) ||
                   (_Var22._M_value - 0x15U < 0xffffffffffffffec)) {
                  local_194 = 1;
                }
                else {
                  ppuVar15 = &local_1a8[2].second.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish;
                  _Var23._M_value = _Var22._M_value;
                  do {
                    if (((long)*ppuVar15 - (long)((_Vector_impl_data *)(ppuVar15 + -1))->_M_start !=
                         0x21) ||
                       ((anonymous_namespace)::KeyConverter::
                        FromPKBytes<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                                  ((optional<CPubKey> *)local_88,(void *)(ulong)ctx->m_script_ctx,
                                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                    )((_Vector_impl_data *)(ppuVar15 + -1))->_M_start,
                                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                    )*ppuVar15),
                       pCVar7 = local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                _M_impl.super__Vector_impl_data._M_finish, local_47 == false))
                    goto LAB_0047774f;
                    if (local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                        super__Vector_impl_data._M_finish ==
                        local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<CPubKey,_std::allocator<CPubKey>_>::_M_realloc_insert<CPubKey>
                                (&local_148,
                                 (iterator)
                                 local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                 _M_impl.super__Vector_impl_data._M_finish,(CPubKey *)local_88);
                    }
                    else {
                      memcpy(local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl
                             .super__Vector_impl_data._M_finish,local_88,0x41);
                      local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                      super__Vector_impl_data._M_finish = pCVar7 + 1;
                    }
                    ppuVar15 = ppuVar15 + 4;
                    _Var23._M_value = _Var23._M_value - 1;
                  } while (_Var23._M_value != 0);
                  oVar26 = internal::ParseScriptNumber(local_1a8 + _Var22._M_value + 2);
                  local_c8._M_value =
                       oVar26.super__Optional_base<long,_true,_true>._M_payload.
                       super__Optional_payload_base<long>._M_payload;
                  p_Stack_c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               CONCAT71(p_Stack_c0._1_7_,
                                        oVar26.super__Optional_base<long,_true,_true>._M_payload.
                                        super__Optional_payload_base<long>._M_engaged);
                  if (((((undefined1  [16])
                         oVar26.super__Optional_base<long,_true,_true>._M_payload.
                         super__Optional_payload_base<long> & (undefined1  [16])0x1) ==
                        (undefined1  [16])0x0) || (local_c8._M_value < 1)) ||
                     ((ulong)_Var22 < (ulong)local_c8)) {
LAB_0047774f:
                    local_194 = 1;
                  }
                  else {
                    pvVar24 = (void *)((long)&(((element_type *)
                                               ((long)local_148.
                                                                                                            
                                                  super__Vector_base<CPubKey,_std::allocator<CPubKey>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish + -0xa8
                                               ))->ops).dsat.value + 3);
                    peVar16 = (element_type *)
                              local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                              _M_impl.super__Vector_impl_data._M_start;
                    if (local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                        super__Vector_impl_data._M_start < pvVar24 &&
                        local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                        super__Vector_impl_data._M_start !=
                        local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                        super__Vector_impl_data._M_finish) {
                      do {
                        puVar6 = (undefined1 *)
                                 ((long)&(peVar16->subs).
                                         super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish + 1);
                        memcpy((shared_ptr<const_miniscript::Node<CPubKey>_> *)local_88,peVar16,0x41
                              );
                        memcpy(peVar16,pvVar24,0x41);
                        memcpy(pvVar24,(shared_ptr<const_miniscript::Node<CPubKey>_> *)local_88,0x41
                              );
                        pvVar24 = (void *)((long)pvVar24 - 0x41);
                        peVar16 = (element_type *)puVar6;
                      } while (puVar6 < pvVar24);
                    }
                    local_168 = (Node<CPubKey> *)CONCAT44(local_168._4_4_,ctx->m_script_ctx);
                    local_14c = 0x19;
                    local_88._0_8_ = (element_type *)0x0;
                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                    __shared_count<miniscript::Node<CPubKey>const,std::allocator<miniscript::Node<CPubKey>>,miniscript::internal::NoDupCheck,miniscript::MiniscriptContext,miniscript::Fragment,std::vector<CPubKey,std::allocator<CPubKey>>,long_const&>
                              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8),
                               (Node<CPubKey> **)local_88,
                               (allocator<miniscript::Node<CPubKey>_> *)&local_170,&local_e9,
                               (MiniscriptContext *)&local_168,(Fragment *)&local_14c,&local_148,
                               &local_c8._M_value);
                    std::
                    vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
                    ::emplace_back<std::shared_ptr<miniscript::Node<CPubKey>const>>
                              ((vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
                                *)&local_128,
                               (shared_ptr<const_miniscript::Node<CPubKey>_> *)local_88);
                    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
                        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
                    }
                    local_1a8 = local_1a8 + _Var22._M_value + 3U;
                    local_194 = 4;
                  }
                }
joined_r0x00477792:
                if ((element_type *)
                    local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                    super__Vector_impl_data._M_start != (element_type *)0x0) {
                  operator_delete(local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)local_148.
                                        super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_148.
                                        super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
                }
              }
              else {
                bVar11 = true;
                if ((lVar20 == 0x60) || (bVar11 = true, oVar13 != OP_NUMEQUAL)) goto LAB_00477371;
                if (ctx->m_script_ctx != TAPSCRIPT) {
                  if (ctx->m_script_ctx == P2WSH) goto LAB_004777fc;
                  goto LAB_004778ba;
                }
                oVar26 = internal::ParseScriptNumber(local_1a8 + 1);
                local_c8._M_value =
                     oVar26.super__Optional_base<long,_true,_true>._M_payload.
                     super__Optional_payload_base<long>._M_payload;
                p_Stack_c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             CONCAT71(p_Stack_c0._1_7_,
                                      oVar26.super__Optional_base<long,_true,_true>._M_payload.
                                      super__Optional_payload_base<long>._M_engaged);
                local_194 = 1;
                if (((oVar26.super__Optional_base<long,_true,_true>._M_payload.
                      super__Optional_payload_base<long>._M_engaged & local_c8._M_value - 1U < 999)
                     != 0) && (local_c8._M_value * 2 + 2 <= lVar19)) {
                  local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)0x0;
                  local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0x0;
                  local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (CPubKey *)0x0;
                  std::vector<CPubKey,_std::allocator<CPubKey>_>::reserve
                            (&local_148,local_c8._M_value);
                  lVar20 = 2;
                  do {
                    local_188 = ppVar10 + 2;
                    lVar20 = lVar20 + 2;
                    if ((lVar19 < lVar20) ||
                       ((local_188->first != OP_CHECKSIGADD && (local_188->first != OP_CHECKSIG))))
                    {
                      local_194 = 1;
                      goto joined_r0x00477792;
                    }
                    local_194 = 1;
                    _Var3._M_current =
                         ppVar10[3].second.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
                    _Var4._M_current =
                         ppVar10[3].second.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                    if (((long)_Var4._M_current - (long)_Var3._M_current != 0x20) ||
                       ((anonymous_namespace)::KeyConverter::
                        FromPKBytes<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                                  ((optional<CPubKey> *)local_88,(void *)(ulong)ctx->m_script_ctx,
                                   _Var3,_Var4),
                       pCVar7 = local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                _M_impl.super__Vector_impl_data._M_finish, local_47 == false))
                    goto joined_r0x00477792;
                    if (local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                        super__Vector_impl_data._M_finish ==
                        local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<CPubKey,_std::allocator<CPubKey>_>::_M_realloc_insert<CPubKey>
                                (&local_148,
                                 (iterator)
                                 local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                 _M_impl.super__Vector_impl_data._M_finish,(CPubKey *)local_88);
                    }
                    else {
                      memcpy(local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl
                             .super__Vector_impl_data._M_finish,local_88,0x41);
                      local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                      super__Vector_impl_data._M_finish = pCVar7 + 1;
                    }
                    lVar21 = (long)local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                   _M_impl.super__Vector_impl_data._M_start;
                    _Var22._M_value = lVar21 * 0xfc0fc0fc0fc0fc1;
                    if (999 < (ulong)_Var22) goto joined_r0x00477792;
                    ppVar10 = local_188;
                  } while (local_188->first != OP_CHECKSIG);
                  if ((ulong)local_c8 <= (ulong)_Var22) {
                    pvVar24 = (void *)((long)&(((element_type *)
                                               ((long)local_148.
                                                                                                            
                                                  super__Vector_base<CPubKey,_std::allocator<CPubKey>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish + -0xa8
                                               ))->ops).dsat.value + 3);
                    peVar16 = (element_type *)
                              local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                              _M_impl.super__Vector_impl_data._M_start;
                    if (local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                        super__Vector_impl_data._M_start < pvVar24 &&
                        local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                        super__Vector_impl_data._M_start !=
                        local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                        super__Vector_impl_data._M_finish) {
                      do {
                        puVar6 = (undefined1 *)
                                 ((long)&(peVar16->subs).
                                         super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish + 1);
                        memcpy(local_88,peVar16,0x41);
                        memcpy(peVar16,pvVar24,0x41);
                        memcpy(pvVar24,local_88,0x41);
                        pvVar24 = (void *)((long)pvVar24 - 0x41);
                        peVar16 = (element_type *)puVar6;
                      } while (puVar6 < pvVar24);
                    }
                    local_168 = (Node<CPubKey> *)CONCAT44(local_168._4_4_,ctx->m_script_ctx);
                    local_14c = 0x1a;
                    local_88._0_8_ = (element_type *)0x0;
                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                    __shared_count<miniscript::Node<CPubKey>const,std::allocator<miniscript::Node<CPubKey>>,miniscript::internal::NoDupCheck,miniscript::MiniscriptContext,miniscript::Fragment,std::vector<CPubKey,std::allocator<CPubKey>>,long_const&>
                              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8),
                               (Node<CPubKey> **)local_88,
                               (allocator<miniscript::Node<CPubKey>_> *)&local_170,&local_e9,
                               (MiniscriptContext *)&local_168,&local_14c,&local_148,
                               &local_c8._M_value);
                    std::
                    vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
                    ::emplace_back<std::shared_ptr<miniscript::Node<CPubKey>const>>
                              ((vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
                                *)&local_128,
                               (shared_ptr<const_miniscript::Node<CPubKey>_> *)local_88);
                    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
                        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
                    }
                    local_1a8 = local_1a8 + lVar21 * -0x7e07e07e07e07e + 2;
                    local_194 = 4;
                  }
                  goto joined_r0x00477792;
                }
              }
              ppVar10 = local_1a8;
              if (local_194 == 4) break;
              goto LAB_004777fc;
            }
            oVar13 = local_1a8->first;
            if (0x40 < lVar20) goto LAB_00476e10;
            bVar11 = false;
LAB_00477371:
            if (oVar13 == OP_VERIFY) {
              local_88._0_4_ = VERIFY;
              local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
              super__Vector_impl_data._M_start._0_4_ = 0xffffffff;
              local_c8._M_value._0_4_ = 0xffffffff;
              std::
              vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
              ::emplace_back<miniscript::internal::DecodeContext,int,int>
                        ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                          *)&local_108,(DecodeContext *)local_88,(int *)&local_148,
                         (int *)&local_c8._M_value);
              local_88._0_8_ = (ulong)(uint)local_88._4_4_ << 0x20;
              local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)CONCAT44(local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,0xffffffff);
              local_c8._M_value._0_4_ = 0xffffffff;
              std::
              vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
              ::emplace_back<miniscript::internal::DecodeContext,int,int>
                        ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                          *)&local_108,(DecodeContext *)local_88,(int *)&local_148,
                         (int *)&local_c8._M_value);
            }
            else if (oVar13 == OP_0NOTEQUAL) {
              local_88._0_4_ = ZERO_NOTEQUAL;
              local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
              super__Vector_impl_data._M_start._0_4_ = 0xffffffff;
              local_c8._M_value._0_4_ = 0xffffffff;
              std::
              vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
              ::emplace_back<miniscript::internal::DecodeContext,int,int>
                        ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                          *)&local_108,(DecodeContext *)local_88,(int *)&local_148,
                         (int *)&local_c8._M_value);
              local_88._0_8_ = (ulong)(uint)local_88._4_4_ << 0x20;
              local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)CONCAT44(local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,0xffffffff);
              local_c8._M_value._0_4_ = 0xffffffff;
              std::
              vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
              ::emplace_back<miniscript::internal::DecodeContext,int,int>
                        ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                          *)&local_108,(DecodeContext *)local_88,(int *)&local_148,
                         (int *)&local_c8._M_value);
            }
            else if (oVar13 == OP_CHECKSIG) {
              local_88._0_4_ = CHECK;
              local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
              super__Vector_impl_data._M_start._0_4_ = 0xffffffff;
              local_c8._M_value._0_4_ = 0xffffffff;
              std::
              vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
              ::emplace_back<miniscript::internal::DecodeContext,int,int>
                        ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                          *)&local_108,(DecodeContext *)local_88,(int *)&local_148,
                         (int *)&local_c8._M_value);
              local_88._0_8_ = (ulong)(uint)local_88._4_4_ << 0x20;
              local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)CONCAT44(local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,0xffffffff);
              local_c8._M_value._0_4_ = 0xffffffff;
              std::
              vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
              ::emplace_back<miniscript::internal::DecodeContext,int,int>
                        ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                          *)&local_108,(DecodeContext *)local_88,(int *)&local_148,
                         (int *)&local_c8._M_value);
            }
            else {
              if (bVar11 && oVar13 == OP_EQUAL) {
                oVar26 = internal::ParseScriptNumber(local_1a8 + 1);
                local_b8._M_value =
                     oVar26.super__Optional_base<long,_true,_true>._M_payload.
                     super__Optional_payload_base<long>._M_payload;
                uStack_ab = SUB83(local_88._0_8_,4);
                auStack_b0._1_4_ = local_88._0_4_;
                auStack_b0[0] =
                     oVar26.super__Optional_base<long,_true,_true>._M_payload.
                     super__Optional_payload_base<long>._M_engaged;
                if (((undefined1  [16])
                     oVar26.super__Optional_base<long,_true,_true>._M_payload.
                     super__Optional_payload_base<long> & (undefined1  [16])0x1) !=
                    (undefined1  [16])0x0) {
                  if (0 < local_b8._M_value) {
                    local_88._0_4_ = 0x11;
                    local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                    super__Vector_impl_data._M_start =
                         (pointer)((ulong)local_148.
                                          super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                          _M_impl.super__Vector_impl_data._M_start &
                                  0xffffffff00000000);
                    std::
                    vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                    ::emplace_back<miniscript::internal::DecodeContext,int,long&>
                              ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                                *)&local_108,(DecodeContext *)local_88,(int *)&local_148,
                               &local_b8._M_value);
                    goto LAB_00476697;
                  }
                  goto LAB_004777fc;
                }
                oVar13 = local_1a8->first;
              }
              if (oVar13 == OP_BOOLOR) {
                local_88._0_4_ = OR_B;
                local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                super__Vector_impl_data._M_start._0_4_ = 0xffffffff;
                local_c8._M_value._0_4_ = 0xffffffff;
                std::
                vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                ::emplace_back<miniscript::internal::DecodeContext,int,int>
                          ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                            *)&local_108,(DecodeContext *)local_88,(int *)&local_148,
                           (int *)&local_c8._M_value);
                local_88._0_4_ = SINGLE_BKV_EXPR;
                local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                super__Vector_impl_data._M_start._0_4_ = 0xffffffff;
                local_c8._M_value._0_4_ = 0xffffffff;
                std::
                vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                ::emplace_back<miniscript::internal::DecodeContext,int,int>
                          ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                            *)&local_108,(DecodeContext *)local_88,(int *)&local_148,
                           (int *)&local_c8._M_value);
                local_88._0_4_ = 2;
                local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                super__Vector_impl_data._M_start =
                     (pointer)CONCAT44(local_148.
                                       super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl
                                       .super__Vector_impl_data._M_start._4_4_,0xffffffff);
                local_c8._M_value._0_4_ = 0xffffffff;
                std::
                vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                ::emplace_back<miniscript::internal::DecodeContext,int,int>
                          ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                            *)&local_108,(DecodeContext *)local_88,(int *)&local_148,
                           (int *)&local_c8._M_value);
              }
              else if (oVar13 == OP_BOOLAND) {
                local_88._0_4_ = AND_B;
                local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                super__Vector_impl_data._M_start._0_4_ = 0xffffffff;
                local_c8._M_value._0_4_ = 0xffffffff;
                std::
                vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                ::emplace_back<miniscript::internal::DecodeContext,int,int>
                          ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                            *)&local_108,(DecodeContext *)local_88,(int *)&local_148,
                           (int *)&local_c8._M_value);
                local_88._0_4_ = SINGLE_BKV_EXPR;
                local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                super__Vector_impl_data._M_start._0_4_ = 0xffffffff;
                local_c8._M_value._0_4_ = 0xffffffff;
                std::
                vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                ::emplace_back<miniscript::internal::DecodeContext,int,int>
                          ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                            *)&local_108,(DecodeContext *)local_88,(int *)&local_148,
                           (int *)&local_c8._M_value);
                local_88._0_4_ = 2;
                local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                super__Vector_impl_data._M_start =
                     (pointer)CONCAT44(local_148.
                                       super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl
                                       .super__Vector_impl_data._M_start._4_4_,0xffffffff);
                local_c8._M_value._0_4_ = 0xffffffff;
                std::
                vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                ::emplace_back<miniscript::internal::DecodeContext,int,int>
                          ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                            *)&local_108,(DecodeContext *)local_88,(int *)&local_148,
                           (int *)&local_c8._M_value);
              }
              else {
                if (oVar13 != OP_ENDIF) goto LAB_004777fc;
                local_88._0_4_ = ENDIF;
                local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                super__Vector_impl_data._M_start._0_4_ = 0xffffffff;
                local_c8._M_value._0_4_ = 0xffffffff;
                std::
                vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                ::emplace_back<miniscript::internal::DecodeContext,int,int>
                          ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                            *)&local_108,(DecodeContext *)local_88,(int *)&local_148,
                           (int *)&local_c8._M_value);
                local_88._0_4_ = 1;
                local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                super__Vector_impl_data._M_start =
                     (pointer)CONCAT44(local_148.
                                       super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl
                                       .super__Vector_impl_data._M_start._4_4_,0xffffffff);
                local_c8._M_value._0_4_ = 0xffffffff;
                std::
                vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                ::emplace_back<miniscript::internal::DecodeContext,int,int>
                          ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                            *)&local_108,(DecodeContext *)local_88,(int *)&local_148,
                           (int *)&local_c8._M_value);
              }
            }
            local_1a8 = local_1a8 + 1;
            break;
          }
          local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,ctx->m_script_ctx);
          local_b8._M_value._0_4_ = 1;
          local_88._0_8_ = (element_type *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<miniscript::Node<CPubKey>const,std::allocator<miniscript::Node<CPubKey>>,miniscript::internal::NoDupCheck,miniscript::MiniscriptContext,miniscript::Fragment>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8),
                     (Node<CPubKey> **)local_88,(allocator<miniscript::Node<CPubKey>_> *)&local_c8,
                     (NoDupCheck *)&local_168,(MiniscriptContext *)&local_148,
                     (Fragment *)&local_b8._M_value);
          std::
          vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
          ::emplace_back<std::shared_ptr<miniscript::Node<CPubKey>const>>
                    ((vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
                      *)&local_128,(shared_ptr<const_miniscript::Node<CPubKey>_> *)local_88);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
        }
LAB_004768fa:
        local_1a8 = local_1a8 + 1;
        break;
      case 1:
        local_88._0_4_ = MAYBE_AND_V;
        local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = 0xffffffff;
        local_b8._M_value._0_4_ = 0xffffffff;
        std::
        vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
        ::emplace_back<miniscript::internal::DecodeContext,int,int>
                  ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                    *)&local_108,(DecodeContext *)local_88,(int *)&local_148,
                   (int *)&local_b8._M_value);
        local_88._0_8_ = (ulong)(uint)local_88._4_4_ << 0x20;
        local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,0xffffffff);
        local_b8._M_value._0_4_ = 0xffffffff;
        std::
        vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
        ::emplace_back<miniscript::internal::DecodeContext,int,int>
                  ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                    *)&local_108,(DecodeContext *)local_88,(int *)&local_148,
                   (int *)&local_b8._M_value);
        break;
      case 2:
        if ((ulong)uVar9 <= local_1a8) goto LAB_004777fc;
        if (local_1a8->first == OP_FROMALTSTACK) {
          local_88._0_4_ = 4;
          local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,0xffffffff);
          local_b8._M_value._0_4_ = 0xffffffff;
          std::
          vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
          ::emplace_back<miniscript::internal::DecodeContext,int,int>
                    ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                      *)&local_108,(DecodeContext *)local_88,(int *)&local_148,
                     (int *)&local_b8._M_value);
          local_1a8 = local_1a8 + 1;
        }
        else {
          local_88._0_4_ = 3;
          local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,0xffffffff);
          local_b8._M_value._0_4_ = 0xffffffff;
          std::
          vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
          ::emplace_back<miniscript::internal::DecodeContext,int,int>
                    ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                      *)&local_108,(DecodeContext *)local_88,(int *)&local_148,
                     (int *)&local_b8._M_value);
        }
        local_88._0_4_ = 1;
        local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,0xffffffff);
        local_b8._M_value._0_4_ = 0xffffffff;
        std::
        vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
        ::emplace_back<miniscript::internal::DecodeContext,int,int>
                  ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                    *)&local_108,(DecodeContext *)local_88,(int *)&local_148,
                   (int *)&local_b8._M_value);
        break;
      case 3:
        if (((local_1a8 < (ulong)uVar9) && (local_1a8->first == OP_SWAP)) &&
           (local_128.
            super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_128.
            super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)) {
          local_b8._M_value._0_4_ = ctx->m_script_ctx;
          local_c8._M_value._0_4_ = 0xb;
          local_88._0_8_ = (element_type *)0x0;
          local_88._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_88._16_8_ = (pointer)0x0;
          std::
          vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
          ::reserve((vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                     *)local_88,1);
          std::
          vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
          ::emplace_back<std::shared_ptr<miniscript::Node<CPubKey>const>>
                    ((vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
                      *)local_88,psVar1 + -1);
          local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<miniscript::Node<CPubKey>const,std::allocator<miniscript::Node<CPubKey>>,miniscript::internal::NoDupCheck,miniscript::MiniscriptContext,miniscript::Fragment,std::vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     &local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                      super__Vector_impl_data._M_finish,(Node<CPubKey> **)&local_148,
                     (allocator<miniscript::Node<CPubKey>_> *)&local_168,(NoDupCheck *)&local_14c,
                     (MiniscriptContext *)&local_b8._M_value,(Fragment *)&local_c8._M_value,
                     (vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                      *)local_88);
          goto LAB_00475a03;
        }
        goto LAB_004777fc;
      case 4:
        if (((local_1a8 < (ulong)uVar9) && (local_1a8->first == OP_TOALTSTACK)) &&
           (local_128.
            super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_128.
            super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)) {
          local_b8._M_value._0_4_ = ctx->m_script_ctx;
          local_c8._M_value._0_4_ = 10;
          local_88._0_8_ = (element_type *)0x0;
          local_88._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_88._16_8_ = (pointer)0x0;
          std::
          vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
          ::reserve((vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                     *)local_88,1);
          std::
          vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
          ::emplace_back<std::shared_ptr<miniscript::Node<CPubKey>const>>
                    ((vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
                      *)local_88,psVar1 + -1);
          local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<miniscript::Node<CPubKey>const,std::allocator<miniscript::Node<CPubKey>>,miniscript::internal::NoDupCheck,miniscript::MiniscriptContext,miniscript::Fragment,std::vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     &local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                      super__Vector_impl_data._M_finish,(Node<CPubKey> **)&local_148,
                     (allocator<miniscript::Node<CPubKey>_> *)&local_168,(NoDupCheck *)&local_14c,
                     (MiniscriptContext *)&local_b8._M_value,(Fragment *)&local_c8._M_value,
                     (vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                      *)local_88);
LAB_00475a03:
          pCVar8 = local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          pCVar7 = local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          p_Var18 = local_128.
                    super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish[-1].
                    super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
          local_128.
          super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].
          super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)pCVar7;
          local_128.
          super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].
          super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pCVar8;
          if (p_Var18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var18);
          }
          if ((element_type *)
              local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
              super__Vector_impl_data._M_finish != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                       super__Vector_impl_data._M_finish);
          }
          local_1a8 = local_1a8 + 1;
          goto LAB_00476234;
        }
        goto LAB_004777fc;
      case 5:
        if (local_128.
            super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_128.
            super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          local_b8._M_value._0_4_ = ctx->m_script_ctx;
          local_c8._M_value._0_4_ = 0xc;
          local_88._0_8_ = (element_type *)0x0;
          local_88._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_88._16_8_ = (pointer)0x0;
          std::
          vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
          ::reserve((vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                     *)local_88,1);
          std::
          vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
          ::emplace_back<std::shared_ptr<miniscript::Node<CPubKey>const>>
                    ((vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
                      *)local_88,psVar1 + -1);
          local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<miniscript::Node<CPubKey>const,std::allocator<miniscript::Node<CPubKey>>,miniscript::internal::NoDupCheck,miniscript::MiniscriptContext,miniscript::Fragment,std::vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     &local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                      super__Vector_impl_data._M_finish,(Node<CPubKey> **)&local_148,
                     (allocator<miniscript::Node<CPubKey>_> *)&local_168,(NoDupCheck *)&local_14c,
                     (MiniscriptContext *)&local_b8._M_value,(Fragment *)&local_c8._M_value,
                     (vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                      *)local_88);
          goto LAB_004761fe;
        }
        goto LAB_004777fc;
      case 6:
        if (local_128.
            super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_128.
            super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          local_b8._M_value._0_4_ = ctx->m_script_ctx;
          local_c8._M_value._0_4_ = 0xd;
          local_88._0_8_ = (element_type *)0x0;
          local_88._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_88._16_8_ = (pointer)0x0;
          std::
          vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
          ::reserve((vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                     *)local_88,1);
          std::
          vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
          ::emplace_back<std::shared_ptr<miniscript::Node<CPubKey>const>>
                    ((vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
                      *)local_88,psVar1 + -1);
          local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<miniscript::Node<CPubKey>const,std::allocator<miniscript::Node<CPubKey>>,miniscript::internal::NoDupCheck,miniscript::MiniscriptContext,miniscript::Fragment,std::vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     &local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                      super__Vector_impl_data._M_finish,(Node<CPubKey> **)&local_148,
                     (allocator<miniscript::Node<CPubKey>_> *)&local_168,(NoDupCheck *)&local_14c,
                     (MiniscriptContext *)&local_b8._M_value,(Fragment *)&local_c8._M_value,
                     (vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                      *)local_88);
          goto LAB_004761fe;
        }
        goto LAB_004777fc;
      case 7:
        if (local_128.
            super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_128.
            super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          local_b8._M_value._0_4_ = ctx->m_script_ctx;
          local_c8._M_value._0_4_ = 0xe;
          local_88._0_8_ = (element_type *)0x0;
          local_88._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_88._16_8_ = (pointer)0x0;
          std::
          vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
          ::reserve((vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                     *)local_88,1);
          std::
          vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
          ::emplace_back<std::shared_ptr<miniscript::Node<CPubKey>const>>
                    ((vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
                      *)local_88,psVar1 + -1);
          local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<miniscript::Node<CPubKey>const,std::allocator<miniscript::Node<CPubKey>>,miniscript::internal::NoDupCheck,miniscript::MiniscriptContext,miniscript::Fragment,std::vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     &local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                      super__Vector_impl_data._M_finish,(Node<CPubKey> **)&local_148,
                     (allocator<miniscript::Node<CPubKey>_> *)&local_168,(NoDupCheck *)&local_14c,
                     (MiniscriptContext *)&local_b8._M_value,(Fragment *)&local_c8._M_value,
                     (vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                      *)local_88);
          goto LAB_004761fe;
        }
        goto LAB_004777fc;
      case 8:
        if (local_128.
            super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_128.
            super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          local_b8._M_value._0_4_ = ctx->m_script_ctx;
          local_c8._M_value._0_4_ = 0xf;
          local_88._0_8_ = (element_type *)0x0;
          local_88._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_88._16_8_ = (pointer)0x0;
          std::
          vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
          ::reserve((vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                     *)local_88,1);
          std::
          vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
          ::emplace_back<std::shared_ptr<miniscript::Node<CPubKey>const>>
                    ((vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
                      *)local_88,psVar1 + -1);
          local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<miniscript::Node<CPubKey>const,std::allocator<miniscript::Node<CPubKey>>,miniscript::internal::NoDupCheck,miniscript::MiniscriptContext,miniscript::Fragment,std::vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     &local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                      super__Vector_impl_data._M_finish,(Node<CPubKey> **)&local_148,
                     (allocator<miniscript::Node<CPubKey>_> *)&local_168,(NoDupCheck *)&local_14c,
                     (MiniscriptContext *)&local_b8._M_value,(Fragment *)&local_c8._M_value,
                     (vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                      *)local_88);
          goto LAB_004761fe;
        }
        goto LAB_004777fc;
      case 9:
        if (local_128.
            super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            local_128.
            super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) goto LAB_004777fc;
        local_b8._M_value._0_4_ = ctx->m_script_ctx;
        local_c8._M_value._0_4_ = 0x10;
        local_88._0_8_ = (element_type *)0x0;
        local_88._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_88._16_8_ = (pointer)0x0;
        std::
        vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
        ::reserve((vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                   *)local_88,1);
        std::
        vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
        ::emplace_back<std::shared_ptr<miniscript::Node<CPubKey>const>>
                  ((vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
                    *)local_88,psVar1 + -1);
        local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<miniscript::Node<CPubKey>const,std::allocator<miniscript::Node<CPubKey>>,miniscript::internal::NoDupCheck,miniscript::MiniscriptContext,miniscript::Fragment,std::vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                    super__Vector_impl_data._M_finish,(Node<CPubKey> **)&local_148,
                   (allocator<miniscript::Node<CPubKey>_> *)&local_168,(NoDupCheck *)&local_14c,
                   (MiniscriptContext *)&local_b8._M_value,(Fragment *)&local_c8._M_value,
                   (vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                    *)local_88);
LAB_004761fe:
        pCVar8 = local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        pCVar7 = local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        p_Var18 = local_128.
                  super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].
                  super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
        local_128.
        super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].
        super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)pCVar7;
        local_128.
        super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].
        super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pCVar8;
        if (p_Var18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var18);
        }
LAB_00476225:
        if ((element_type *)
            local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
            super__Vector_impl_data._M_finish != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                     super__Vector_impl_data._M_finish);
        }
LAB_00476234:
        std::
        vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
        ::~vector((vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                   *)local_88);
        break;
      case 10:
        if ((local_1a8 < (ulong)uVar9) &&
           ((uVar12 = local_1a8->first - OP_IF, 0x19 < uVar12 ||
            ((0x2000113U >> (uVar12 & 0x1f) & 1) == 0)))) {
          local_88._0_4_ = AND_V;
          local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ = 0xffffffff;
          local_b8._M_value._0_4_ = 0xffffffff;
          std::
          vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
          ::emplace_back<miniscript::internal::DecodeContext,int,int>
                    ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                      *)&local_108,(DecodeContext *)local_88,(int *)&local_148,
                     (int *)&local_b8._M_value);
          local_88._0_4_ = 1;
          local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,0xffffffff);
          local_b8._M_value._0_4_ = 0xffffffff;
          std::
          vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
          ::emplace_back<miniscript::internal::DecodeContext,int,int>
                    ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                      *)&local_108,(DecodeContext *)local_88,(int *)&local_148,
                     (int *)&local_b8._M_value);
        }
        break;
      case 0xb:
        uVar14 = (long)local_128.
                       super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_128.
                       super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        nt = AND_V;
        goto LAB_00475921;
      case 0xc:
        uVar14 = (long)local_128.
                       super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_128.
                       super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        nt = AND_B;
        goto LAB_00475921;
      case 0xd:
        if ((ulong)((long)local_128.
                          super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_128.
                         super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) < 0x21) goto LAB_004777fc;
        psVar1 = local_128.
                 super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1;
        local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)local_128.
                      super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish[-1].
                      super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr;
        local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)local_128.
                      super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish[-1].
                      super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi;
        local_128.
        super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].
        super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_128.
        super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].
        super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        p_Var18 = local_128.
                  super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].
                  super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
        local_128.
        super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = psVar1;
        if (p_Var18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var18);
        }
        psVar1 = local_128.
                 super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1;
        local_b8 = *(_Storage<long,_true> *)
                    (local_128.
                     super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish + -1);
        _auStack_b0 = local_128.
                      super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish[-1].
                      super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi;
        local_128.
        super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].
        super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_128.
        super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].
        super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        p_Var18 = local_128.
                  super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].
                  super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
        local_128.
        super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = psVar1;
        if (p_Var18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var18);
        }
        local_c8 = *(_Storage<long,_true> *)
                    (local_128.
                     super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish + -1);
        p_Stack_c0 = local_128.
                     super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish[-1].
                     super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
        local_128.
        super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].
        super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_128.
        super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].
        super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_14c = ctx->m_script_ctx;
        local_170 = ANDOR;
        local_88._16_8_ = (pointer)0x0;
        local_88._0_8_ = (element_type *)0x0;
        local_88._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        std::
        vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
        ::reserve((vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                   *)local_88,3);
        std::
        vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
        ::emplace_back<std::shared_ptr<miniscript::Node<CPubKey>const>>
                  ((vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
                    *)local_88,(shared_ptr<const_miniscript::Node<CPubKey>_> *)&local_148);
        std::
        vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
        ::emplace_back<std::shared_ptr<miniscript::Node<CPubKey>const>>
                  ((vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
                    *)local_88,(shared_ptr<const_miniscript::Node<CPubKey>_> *)&local_c8);
        std::
        vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
        ::emplace_back<std::shared_ptr<miniscript::Node<CPubKey>const>>
                  ((vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
                    *)local_88,(shared_ptr<const_miniscript::Node<CPubKey>_> *)&local_b8);
        local_168 = (element_type *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<miniscript::Node<CPubKey>const,std::allocator<miniscript::Node<CPubKey>>,miniscript::internal::NoDupCheck,miniscript::MiniscriptContext,miniscript::Fragment,std::vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>>
                  (a_Stack_160,&local_168,(allocator<miniscript::Node<CPubKey>_> *)&local_e9,
                   &local_169,&local_14c,&local_170,
                   (vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                    *)local_88);
        _Var17._M_pi = a_Stack_160[0]._M_pi;
        pNVar25 = local_168;
        local_168 = (Node<CPubKey> *)0x0;
        a_Stack_160[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        p_Var18 = local_128.
                  super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].
                  super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
        local_128.
        super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].
        super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             pNVar25;
        local_128.
        super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].
        super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = _Var17._M_pi;
        if (p_Var18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var18);
        }
        if (a_Stack_160[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_160[0]._M_pi);
        }
        std::
        vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
        ::~vector((vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                   *)local_88);
        if (p_Stack_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_c0);
        }
        peVar16 = (element_type *)
                  local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        if (_auStack_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_auStack_b0);
          peVar16 = (element_type *)
                    local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        }
LAB_00475ed3:
        if (peVar16 != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar16);
        }
        break;
      case 0xe:
        uVar14 = (long)local_128.
                       super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_128.
                       super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        nt = OR_B;
        goto LAB_00475921;
      case 0xf:
        uVar14 = (long)local_128.
                       super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_128.
                       super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        nt = OR_C;
        goto LAB_00475921;
      case 0x10:
        uVar14 = (long)local_128.
                       super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_128.
                       super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        nt = OR_D;
LAB_00475921:
        if (uVar14 < 0x11) goto LAB_004777fc;
LAB_0047592b:
        internal::BuildBack<CPubKey>(ctx->m_script_ctx,nt,&local_128,true);
        break;
      case 0x11:
        if ((ulong)uVar9 <= local_1a8) goto LAB_004777fc;
        if (local_1a8->first == OP_ADD) {
          local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ = 0x11;
          local_88._0_8_ = uStack_a0 + 1;
          std::
          vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
          ::emplace_back<miniscript::internal::DecodeContext,long,long&>
                    ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                      *)&local_108,(DecodeContext *)&local_148,(long *)local_88,&local_a8);
          local_88._0_4_ = 2;
          local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,0xffffffff);
          local_b8._M_value._0_4_ = 0xffffffff;
          std::
          vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
          ::emplace_back<miniscript::internal::DecodeContext,int,int>
                    ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                      *)&local_108,(DecodeContext *)local_88,(int *)&local_148,
                     (int *)&local_b8._M_value);
          goto LAB_004768fa;
        }
        local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = 0x12;
        local_88._0_8_ = uStack_a0 + 1;
        std::
        vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
        ::emplace_back<miniscript::internal::DecodeContext,long,long&>
                  ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                    *)&local_108,(DecodeContext *)&local_148,(long *)local_88,&local_a8);
        local_88._0_8_ = local_88._0_8_ & 0xffffffff00000000;
        local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,0xffffffff);
        local_b8._M_value._0_4_ = 0xffffffff;
        std::
        vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
        ::emplace_back<miniscript::internal::DecodeContext,int,int>
                  ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                    *)&local_108,(DecodeContext *)local_88,(int *)&local_148,
                   (int *)&local_b8._M_value);
        break;
      case 0x12:
        if (((0 < local_a8) && (local_a8 <= (long)uStack_a0)) &&
           (uStack_a0 <=
            (ulong)((long)local_128.
                          super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_128.
                          super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 4))) {
          local_88._0_8_ = (element_type *)0x0;
          local_88._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_88._16_8_ = (pointer)0x0;
          lVar19 = 0;
          do {
            psVar1 = local_128.
                     super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish + -1;
            local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)local_128.
                          super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish[-1].
                          super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr;
            local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 (pointer)local_128.
                          super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish[-1].
                          super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi;
            local_128.
            super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1].
            super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_128.
            super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1].
            super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            p_Var18 = local_128.
                      super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish[-1].
                      super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi;
            local_128.
            super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = psVar1;
            if (p_Var18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var18);
            }
            std::
            vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
            ::emplace_back<std::shared_ptr<miniscript::Node<CPubKey>const>>
                      ((vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
                        *)local_88,(shared_ptr<const_miniscript::Node<CPubKey>_> *)&local_148);
            if ((element_type *)
                local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                super__Vector_impl_data._M_finish != (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                         super__Vector_impl_data._M_finish);
            }
            lVar19 = lVar19 + 1;
          } while (lVar19 < (long)uStack_a0);
          local_b8._M_value._0_4_ = ctx->m_script_ctx;
          local_c8._M_value._0_4_ = 0x18;
          local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<miniscript::Node<CPubKey>const,std::allocator<miniscript::Node<CPubKey>>,miniscript::internal::NoDupCheck,miniscript::MiniscriptContext,miniscript::Fragment,std::vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>,long&>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     &local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                      super__Vector_impl_data._M_finish,(Node<CPubKey> **)&local_148,
                     (allocator<miniscript::Node<CPubKey>_> *)&local_168,(NoDupCheck *)&local_14c,
                     (MiniscriptContext *)&local_b8._M_value,(Fragment *)&local_c8._M_value,
                     (vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                      *)local_88,&local_a8);
          std::
          vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
          ::emplace_back<std::shared_ptr<miniscript::Node<CPubKey>const>>
                    ((vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
                      *)&local_128,(shared_ptr<const_miniscript::Node<CPubKey>_> *)&local_148);
          goto LAB_00476225;
        }
        goto LAB_004777fc;
      case 0x13:
        if ((ulong)uVar9 <= local_1a8) goto LAB_004777fc;
        oVar13 = local_1a8->first;
        if (oVar13 == OP_IF) {
          if (uVar9 - (long)local_1a8 < 0x21) goto LAB_004777fc;
          if (local_1a8[1].first == OP_DUP) {
            local_88._0_4_ = 6;
            local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)CONCAT44(local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                   _M_impl.super__Vector_impl_data._M_start._4_4_,0xffffffff);
            local_b8._M_value._0_4_ = 0xffffffff;
            std::
            vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
            ::emplace_back<miniscript::internal::DecodeContext,int,int>
                      ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                        *)&local_108,(DecodeContext *)local_88,(int *)&local_148,
                       (int *)&local_b8._M_value);
LAB_00476697:
            local_1a8 = local_1a8 + 2;
          }
          else {
            if (((uVar9 - (long)local_1a8 == 0x40) || (local_1a8[1].first != OP_0NOTEQUAL)) ||
               (local_1a8[2].first != OP_SIZE)) goto LAB_004777fc;
            local_88._0_4_ = 8;
            local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)CONCAT44(local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                   _M_impl.super__Vector_impl_data._M_start._4_4_,0xffffffff);
            local_b8._M_value._0_4_ = 0xffffffff;
            std::
            vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
            ::emplace_back<miniscript::internal::DecodeContext,int,int>
                      ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                        *)&local_108,(DecodeContext *)local_88,(int *)&local_148,
                       (int *)&local_b8._M_value);
            local_1a8 = local_1a8 + 3;
          }
        }
        else {
          if (oVar13 == OP_NOTIF) {
            local_88._0_4_ = 0x14;
            local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)CONCAT44(local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                   _M_impl.super__Vector_impl_data._M_start._4_4_,0xffffffff);
            local_b8._M_value._0_4_ = 0xffffffff;
            std::
            vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
            ::emplace_back<miniscript::internal::DecodeContext,int,int>
                      ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                        *)&local_108,(DecodeContext *)local_88,(int *)&local_148,
                       (int *)&local_b8._M_value);
            goto LAB_004768fa;
          }
          if (oVar13 != OP_ELSE) goto LAB_004777fc;
          local_88._0_4_ = ENDIF_ELSE;
          local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ = 0xffffffff;
          local_b8._M_value._0_4_ = 0xffffffff;
          std::
          vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
          ::emplace_back<miniscript::internal::DecodeContext,int,int>
                    ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                      *)&local_108,(DecodeContext *)local_88,(int *)&local_148,
                     (int *)&local_b8._M_value);
          local_88._0_4_ = 1;
          local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,0xffffffff);
          local_b8._M_value._0_4_ = 0xffffffff;
          std::
          vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
          ::emplace_back<miniscript::internal::DecodeContext,int,int>
                    ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                      *)&local_108,(DecodeContext *)local_88,(int *)&local_148,
                     (int *)&local_b8._M_value);
          local_1a8 = local_1a8 + 1;
        }
        break;
      case 0x14:
        if ((ulong)uVar9 <= local_1a8) goto LAB_004777fc;
        if (local_1a8->first == OP_IFDUP) {
          local_88._0_4_ = 0x10;
          local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,0xffffffff);
          local_b8._M_value._0_4_ = 0xffffffff;
          std::
          vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
          ::emplace_back<miniscript::internal::DecodeContext,int,int>
                    ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                      *)&local_108,(DecodeContext *)local_88,(int *)&local_148,
                     (int *)&local_b8._M_value);
          local_1a8 = local_1a8 + 1;
        }
        else {
          local_88._0_4_ = 0xf;
          local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,0xffffffff);
          local_b8._M_value._0_4_ = 0xffffffff;
          std::
          vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
          ::emplace_back<miniscript::internal::DecodeContext,int,int>
                    ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                      *)&local_108,(DecodeContext *)local_88,(int *)&local_148,
                     (int *)&local_b8._M_value);
        }
        local_88._0_8_ = local_88._0_8_ & 0xffffffff00000000;
        local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,0xffffffff);
        local_b8._M_value._0_4_ = 0xffffffff;
        std::
        vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
        ::emplace_back<miniscript::internal::DecodeContext,int,int>
                  ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                    *)&local_108,(DecodeContext *)local_88,(int *)&local_148,
                   (int *)&local_b8._M_value);
        break;
      case 0x15:
        if (local_1a8 < (ulong)uVar9) {
          if (local_1a8->first == OP_NOTIF) {
            local_88._0_4_ = ANDOR;
            local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
            super__Vector_impl_data._M_start._0_4_ = 0xffffffff;
            local_b8._M_value._0_4_ = 0xffffffff;
            std::
            vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
            ::emplace_back<miniscript::internal::DecodeContext,int,int>
                      ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                        *)&local_108,(DecodeContext *)local_88,(int *)&local_148,
                       (int *)&local_b8._M_value);
            local_88._0_8_ = (ulong)(uint)local_88._4_4_ << 0x20;
            local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)CONCAT44(local_148.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                   _M_impl.super__Vector_impl_data._M_start._4_4_,0xffffffff);
            local_b8._M_value._0_4_ = 0xffffffff;
            std::
            vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
            ::emplace_back<miniscript::internal::DecodeContext,int,int>
                      ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                        *)&local_108,(DecodeContext *)local_88,(int *)&local_148,
                       (int *)&local_b8._M_value);
            local_1a8 = local_1a8 + 1;
            break;
          }
          if (local_1a8->first == OP_IF) {
            local_1a8 = local_1a8 + 1;
            nt = OR_I;
            goto LAB_0047592b;
          }
        }
        goto LAB_004777fc;
      }
switchD_00475658_default:
      if (local_108 == pvStack_100) goto LAB_004777a1;
      goto LAB_004755ef;
    }
LAB_004777a1:
    ppVar10 = local_1a8;
    if ((long)local_128.
              super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_128.
              super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x10) {
      pNVar25 = ((local_128.
                  super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr;
      p_Var18 = ((local_128.
                  super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      ((local_128.
        super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start)->
      super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           (element_type *)0x0;
      ((local_128.
        super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start)->
      super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      Node<CPubKey>::DuplicateKeyCheck<(anonymous_namespace)::KeyConverter>(pNVar25,ctx);
      bVar11 = Node<CPubKey>::IsValid(pNVar25);
      if ((!bVar11) || (((pNVar25->typ).m_flags & 1) == 0)) {
        if (p_Var18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var18);
        }
        goto LAB_004777fc;
      }
    }
    else {
LAB_004777fc:
      local_1a8 = ppVar10;
      pNVar25 = (Node<CPubKey> *)0x0;
      p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    std::
    vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
    ::~vector(&local_128);
    _Var17._M_pi = extraout_RDX_00;
    if (local_108 != (void *)0x0) {
      operator_delete(local_108,local_f8 - (long)local_108);
      _Var17._M_pi = extraout_RDX_01;
    }
    if ((pNVar25 == (Node<CPubKey> *)0x0) ||
       (local_1a8 !=
        local_e8._M_value.
        super__Vector_base<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      *(undefined8 *)this = 0;
      *(undefined8 *)(this + 8) = 0;
      if (p_Var18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var18);
        _Var17._M_pi = extraout_RDX_02;
      }
    }
    else {
      *(Node<CPubKey> **)this = pNVar25;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = p_Var18;
    }
  }
  if (local_d0 == '\x01') {
    local_d0 = '\0';
    std::
    vector<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
    ::~vector(&local_e8._M_value);
    _Var17._M_pi = extraout_RDX_03;
  }
  peVar16 = *(element_type **)(in_FS_OFFSET + 0x28);
  if (peVar16 != local_38) {
LAB_00477d4b:
    __stack_chk_fail();
  }
LAB_00477895:
  NVar27.super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = _Var17._M_pi;
  NVar27.super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar16;
  return (NodeRef<typename_KeyConverter::Key>)
         NVar27.super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline NodeRef<typename Ctx::Key> FromScript(const CScript& script, const Ctx& ctx) {
    using namespace internal;
    // A too large Script is necessarily invalid, don't bother parsing it.
    if (script.size() > MaxScriptSize(ctx.MsContext())) return {};
    auto decomposed = DecomposeScript(script);
    if (!decomposed) return {};
    auto it = decomposed->begin();
    auto ret = DecodeScript<typename Ctx::Key>(it, decomposed->end(), ctx);
    if (!ret) return {};
    if (it != decomposed->end()) return {};
    return ret;
}